

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall Js::ByteCodeWriter::EndSubexpression(ByteCodeWriter *this,ParseNode *node)

{
  int iVar1;
  charcount_t cVar2;
  SubexpressionNode *pSVar3;
  ScriptContext *pSVar4;
  StatementMap *pStatementMap;
  SubexpressionNode SVar5;
  
  if (this->m_isInDebugMode == true) {
    iVar1 = ((ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
              *)this->m_subexpressionNodesStack)->count;
    if (iVar1 != 0) {
      pSVar3 = JsUtil::
               ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
               ::Item((ReadOnlyList<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_DefaultComparer>
                       *)this->m_subexpressionNodesStack,iVar1 + -1);
      if ((pSVar3->node == node) && ((this->m_byteCodeData).currentOffset != this->m_beginCodeSpan))
      {
        pSVar4 = FunctionProxy::GetScriptContext((FunctionProxy *)this->m_functionWrite);
        pStatementMap = FunctionBody::StatementMap::New(pSVar4->recycler);
        if (pStatementMap != (StatementMap *)0x0) {
          cVar2 = node->ichLim;
          (pStatementMap->sourceSpan).begin = node->ichMin;
          (pStatementMap->sourceSpan).end = cVar2;
          SVar5 = JsUtil::
                  Stack<Js::ByteCodeWriter::SubexpressionNode,_Memory::ArenaAllocator,_false,_DefaultComparer>
                  ::Pop(this->m_subexpressionNodesStack);
          (pStatementMap->byteCodeSpan).begin = SVar5.beginCodeSpan;
          (pStatementMap->byteCodeSpan).end = (this->m_byteCodeData).currentOffset - 1;
          pStatementMap->isSubexpression = true;
          FunctionBody::RecordStatementMap(this->m_functionWrite,pStatementMap);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EndSubexpression(ParseNode* node)
    {
        if (!m_isInDebugMode || m_subexpressionNodesStack->Empty() || m_subexpressionNodesStack->Peek().node != node)
        {
            return;
        }

        if (m_byteCodeData.GetCurrentOffset() != m_beginCodeSpan)
        {
            FunctionBody::StatementMap* pCurrentStatement = FunctionBody::StatementMap::New(this->m_functionWrite->GetScriptContext()->GetRecycler());

            if (pCurrentStatement)
            {
                pCurrentStatement->sourceSpan.begin = node->ichMin;
                pCurrentStatement->sourceSpan.end = node->ichLim;

                SubexpressionNode subexpressionNode = m_subexpressionNodesStack->Pop();
                pCurrentStatement->byteCodeSpan.begin = subexpressionNode.beginCodeSpan;
                pCurrentStatement->byteCodeSpan.end = m_byteCodeData.GetCurrentOffset() - 1;
                pCurrentStatement->isSubexpression = true;

                m_functionWrite->RecordStatementMap(pCurrentStatement);
            }
        }
    }